

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

FLOAT __thiscall Matrix::mean(Matrix *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  
  iVar1 = this->m;
  uVar2 = this->n;
  if ((long)iVar1 < 1) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    lVar3 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar4 = 0;
        do {
          dVar5 = dVar5 + this->val[lVar3][uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != iVar1);
  }
  return dVar5 / (double)(int)(iVar1 * uVar2);
}

Assistant:

FLOAT Matrix::mean () {
  FLOAT mean = 0;
  for (int32_t i=0; i<m; i++)
    for (int32_t j=0; j<n; j++)
      mean += val[i][j];
  return mean/(FLOAT)(m*n);
}